

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_remove_pending(filemgr *old_file,filemgr *new_file,err_log_callback *log_callback)

{
  uint32_t uVar1;
  int iVar2;
  filemgr *pfVar3;
  err_log_callback *in_RDX;
  filemgr *in_RSI;
  undefined8 *in_RDI;
  filemgr *new_file_of_old_file;
  int ret;
  char *in_stack_000001f8;
  char *in_stack_00000200;
  fdb_status in_stack_0000020c;
  err_log_callback *in_stack_00000210;
  filemgr_ops *in_stack_00000218;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_RSI != (filemgr *)0x0) {
    pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x34));
    uVar1 = atomic_get_uint32_t((atomic<unsigned_int> *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                (memory_order)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if (uVar1 == 0) {
      pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x34));
      pfVar3 = filemgr_get_instance
                         ((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (((lazy_file_deletion_enabled & 1U) == 0) ||
         ((pfVar3 != (filemgr *)0x0 && ((pfVar3->in_place_compaction & 1U) != 0)))) {
        remove((char *)*in_RDI);
      }
      filemgr_remove_file(in_RSI,in_RDX);
    }
    else {
      assign_new_filename((filemgr *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
      atomic_store_uint8_t
                ((atomic<unsigned_char> *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38),
                 (memory_order)in_stack_ffffffffffffffd8);
      iVar2 = unlink((char *)*in_RDI);
      _log_errno_str(in_stack_00000218,in_stack_00000210,in_stack_0000020c,in_stack_00000200,
                     in_stack_000001f8);
      pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x34));
      pthread_spin_lock(&in_RSI->lock);
      assign_old_filename((filemgr *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
      pthread_spin_unlock(&in_RSI->lock);
    }
  }
  return;
}

Assistant:

void filemgr_remove_pending(struct filemgr *old_file,
                            struct filemgr *new_file,
                            err_log_callback *log_callback)
{
    if (new_file == NULL) {
        return;
    }

    spin_lock(&old_file->lock);
    if (atomic_get_uint32_t(&old_file->ref_count) > 0) {
        // delay removing
        assign_new_filename(old_file, new_file->filename);
        atomic_store_uint8_t(&old_file->status, FILE_REMOVED_PENDING);

#if !(defined(WIN32) || defined(_WIN32))
        // Only for Posix
        int ret;
        ret = unlink(old_file->filename);
        _log_errno_str(old_file->ops, log_callback, (fdb_status)ret,
                       "UNLINK", old_file->filename);
#endif

        spin_unlock(&old_file->lock);

        // Update new_file's old_filename
        spin_lock(&new_file->lock);
        assign_old_filename(new_file, old_file->filename);
        spin_unlock(&new_file->lock);
    } else {
        // immediatly remove
        // LCOV_EXCL_START
        spin_unlock(&old_file->lock);

        struct filemgr *new_file_of_old_file =
            filemgr_get_instance(old_file->new_filename);

        if (!lazy_file_deletion_enabled ||
            (new_file_of_old_file && new_file_of_old_file->in_place_compaction)) {
            remove(old_file->filename);
        }
        filemgr_remove_file(old_file, log_callback);
        // LCOV_EXCL_STOP
    }
}